

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

int HandleTidy(string *runCmd,string *sourceFile,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *orig_cmd)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  int ret;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tidy_cmd;
  string stdErr;
  string stdOut;
  
  iVar3 = 1;
  cmSystemTools::ExpandedListArgument(&tidy_cmd,runCmd,true);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&tidy_cmd,sourceFile);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&tidy_cmd,
             (char (*) [3])0x493e4a);
  cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&tidy_cmd,orig_cmd);
  stdOut._M_dataplus._M_p = (pointer)&stdOut.field_2;
  stdOut._M_string_length = 0;
  stdOut.field_2._M_local_buf[0] = '\0';
  stdErr._M_dataplus._M_p = (pointer)&stdErr.field_2;
  stdErr._M_string_length = 0;
  stdErr.field_2._M_local_buf[0] = '\0';
  bVar1 = cmSystemTools::RunSingleCommand
                    (&tidy_cmd,&stdOut,&stdErr,&ret,(char *)0x0,OUTPUT_NONE,(cmDuration)0x0,Auto);
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,(string *)&stdOut);
    if (ret == 0) {
      iVar3 = 0;
    }
    else {
      std::operator<<((ostream *)&std::cerr,(string *)&stdErr);
      iVar3 = ret;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error running \'");
    poVar2 = std::operator<<(poVar2,(string *)
                                    tidy_cmd.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    poVar2 = std::operator<<(poVar2,"\': ");
    poVar2 = std::operator<<(poVar2,(string *)&stdErr);
    std::operator<<(poVar2,"\n");
  }
  std::__cxx11::string::~string((string *)&stdErr);
  std::__cxx11::string::~string((string *)&stdOut);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tidy_cmd);
  return iVar3;
}

Assistant:

static int HandleTidy(const std::string& runCmd, const std::string& sourceFile,
                      const std::vector<std::string>& orig_cmd)
{
  // Construct the clang-tidy command line by taking what was given
  // and adding our compiler command line.  The clang-tidy tool will
  // automatically skip over the compiler itself and extract the
  // options.
  int ret;
  std::vector<std::string> tidy_cmd =
    cmSystemTools::ExpandedListArgument(runCmd, true);
  tidy_cmd.push_back(sourceFile);
  tidy_cmd.emplace_back("--");
  cmAppend(tidy_cmd, orig_cmd);

  // Run the tidy command line.  Capture its stdout and hide its stderr.
  std::string stdOut;
  std::string stdErr;
  if (!cmSystemTools::RunSingleCommand(tidy_cmd, &stdOut, &stdErr, &ret,
                                       nullptr, cmSystemTools::OUTPUT_NONE)) {
    std::cerr << "Error running '" << tidy_cmd[0] << "': " << stdErr << "\n";
    return 1;
  }
  // Output the stdout from clang-tidy to stderr
  std::cerr << stdOut;
  // If clang-tidy exited with an error do the same.
  if (ret != 0) {
    std::cerr << stdErr;
  }
  return ret;
}